

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::setEBHomogDirichlet
          (MLEBABecLap *this,int amrlev,Vector<double,_std::allocator<double>_> *hv_beta)

{
  Location LVar1;
  pointer puVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  long lVar4;
  long *plVar5;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  uint uVar6;
  MLEBABecLap *pMVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  FabType FVar11;
  EBFArrayBoxFactory *this_01;
  pointer *ppbVar12;
  ulong uVar13;
  long lVar14;
  size_t __n;
  uint32_t *puVar15;
  void *pvVar16;
  int iVar17;
  pointer *ppdVar18;
  long lVar19;
  int mglev;
  int k;
  int iVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Periodicity PVar26;
  int ncomp;
  int ngrow;
  MFIter mfi;
  DeviceVector<Real> dv_beta;
  uint local_214;
  pointer *local_210;
  MLEBABecLap *local_208;
  FabArray<amrex::EBCellFlagFab> *local_200;
  long local_1f8;
  int local_1ec;
  long local_1e8;
  ulong local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  size_t local_1c0;
  ulong local_1b8;
  Location local_1b0;
  Box local_1ac;
  long local_190;
  ulong local_188;
  Array4<double> local_180;
  undefined1 local_140 [64];
  undefined1 local_100 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_f0;
  int local_d8;
  Vector<int,_std::allocator<int>_> *local_c0;
  PODVector<double,_std::allocator<double>_> local_a0;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_214 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  LVar1 = this->m_phi_loc;
  lVar21 = (long)amrlev;
  local_208 = this;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_180.p._0_4_ = (uint)(LVar1 == CellCentroid);
    local_100._1_7_ = 0;
    local_100[0] = 1;
    local_100._8_4_ = 0;
    local_100._12_4_ = 0;
    vStack_f0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_f0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_f0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)local_140,
               *(DistributionMapping **)
                &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               *(int **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar21].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(int *)&local_214,(MFInfo *)&local_180,(FabFactory<amrex::FArrayBox> *)local_100);
    uVar10 = local_140._0_8_;
    puVar2 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_140._0_8_ = (double *)0x0;
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar2[lVar21]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar2[lVar21]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar10;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((double *)local_140._0_8_ != (double *)0x0) {
      (**(code **)((long)*(double *)local_140._0_8_ + 8))();
    }
    local_140._0_8_ = (MultiFab *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_f0);
  }
  local_210 = (pointer *)hv_beta;
  local_1e8 = lVar21;
  local_1b0 = LVar1;
  if (**(long **)&(local_208->m_eb_b_coeffs).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar21].
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      == 0) {
    lVar19 = 0;
    lVar22 = 0;
    for (lVar14 = 0; pMVar7 = local_208,
        lVar14 < (local_208->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_1e8]; lVar14 = lVar14 + 1) {
      local_180.p._0_4_ = 0;
      local_100._1_7_ = 0;
      local_100[0] = 1;
      vStack_f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_100._8_4_ = 0;
      local_100._12_4_ = 0;
      vStack_f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)local_140,
                 (DistributionMapping *)
                 (*(long *)&(local_208->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids
                            .
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar21].
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
                 lVar22),(int *)(*(long *)&(local_208->super_MLCellABecLap).super_MLCellLinOp.
                                           super_MLLinOp.m_dmap.
                                           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                           .
                                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                + lVar19),(int *)&local_214,(MFInfo *)&local_180,
                 (FabFactory<amrex::FArrayBox> *)local_100);
      uVar10 = local_140._0_8_;
      lVar4 = *(long *)&(pMVar7->m_eb_b_coeffs).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar21].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      local_140._0_8_ = (double *)0x0;
      plVar5 = *(long **)(lVar4 + lVar14 * 8);
      *(undefined8 *)(lVar4 + lVar14 * 8) = uVar10;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))();
      }
      if ((double *)local_140._0_8_ != (double *)0x0) {
        (**(code **)((long)*(double *)local_140._0_8_ + 8))();
      }
      local_140._0_8_ = (MultiFab *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_f0);
      lVar22 = lVar22 + 0x68;
      lVar19 = lVar19 + 0x10;
    }
  }
  lVar22 = **(long **)&(local_208->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar21].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_190 = lVar21 * 0x18;
  if (lVar22 == 0) {
    local_200 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    ppdVar18 = local_210;
    lVar21 = local_1e8;
  }
  else {
    local_200 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar22,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    lVar21 = local_1e8;
    ppdVar18 = local_210;
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      local_200 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    }
  }
  PODVector<double,_std::allocator<double>_>::PODVector
            (&local_a0,(long)ppdVar18[1] - (long)*ppdVar18 >> 3);
  __n = (long)ppdVar18[1] - (long)*ppdVar18;
  if (__n != 0) {
    memcpy(local_a0.m_data,*ppdVar18,__n);
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_100,
                 (FabArrayBase *)
                 (local_208->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 &local_44);
  while ((int)vStack_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < local_d8) {
    MFIter::tilebox(&local_1ac,(MFIter *)local_100);
    pMVar7 = local_208;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_140,
               (FabArray<amrex::FArrayBox> *)
               (local_208->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
               (MFIter *)local_100);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_180,
               (FabArray<amrex::FArrayBox> *)
               **(undefined8 **)
                 ((long)&(((pMVar7->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_190),(MFIter *)local_100)
    ;
    if (local_200 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      bVar23 = true;
    }
    else {
      ppbVar12 = &vStack_f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_c0 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar12 = (pointer *)
                   ((local_c0->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)vStack_f0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      FVar11 = EBCellFlagFab::getType
                         ((local_200->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar12],&local_1ac);
      bVar23 = (uint)(FVar11 + singlevalued) < 2;
    }
    iVar9 = local_1ac.bigend.vect[1];
    iVar8 = local_1ac.bigend.vect[0];
    ppdVar18 = (pointer *)(long)local_1ac.smallend.vect[0];
    local_1ec = local_1ac.smallend.vect[2];
    local_1c8 = CONCAT44(local_1c8._4_4_,local_1ac.bigend.vect[2]);
    local_1d8 = (long)ppdVar18 << 3;
    local_1d0 = CONCAT44(local_1d0._4_4_,local_1ac.smallend.vect[1]);
    local_1e0 = (ulong)local_1ac.smallend.vect[1];
    local_1c0 = (ulong)(uint)(local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) * 8 + 8;
    uVar6 = local_214;
    if ((int)local_214 < 1) {
      uVar6 = 0;
    }
    local_188 = (ulong)uVar6;
    local_1f8 = 0;
    local_210 = ppdVar18;
    for (local_1b8 = 0; iVar17 = local_1ec, local_1b8 != local_188; local_1b8 = local_1b8 + 1) {
      for (; iVar17 <= (int)local_1c8; iVar17 = iVar17 + 1) {
        lVar21 = local_140._8_8_ * 8;
        pvVar16 = (void *)(local_140._0_8_ +
                          local_140._24_8_ * local_1f8 +
                          (local_1e0 - (long)(int)local_140._36_4_) * lVar21 +
                          (long)(iVar17 - local_140._40_4_) * local_140._16_8_ * 8 +
                          (long)(int)local_140._32_4_ * -8 + local_1d8);
        for (iVar20 = (int)local_1d0; iVar20 <= iVar9; iVar20 = iVar20 + 1) {
          if ((int)ppdVar18 <= iVar8) {
            memset(pvVar16,0,local_1c0);
            ppdVar18 = local_210;
          }
          pvVar16 = (void *)((long)pvVar16 + lVar21);
        }
      }
      local_1f8 = local_1f8 + 8;
    }
    if (bVar23) {
      local_1f8 = 0;
      uVar13 = 0;
      while (iVar17 = local_1ec, uVar13 != local_188) {
        for (; local_1b8 = uVar13, iVar17 <= (int)local_1c8; iVar17 = iVar17 + 1) {
          lVar21 = local_180.jstride * 8;
          pvVar16 = (void *)(local_180.nstride * local_1f8 +
                             (local_1e0 - (long)local_180.begin.y) * lVar21 +
                             (iVar17 - local_180.begin.z) * local_180.kstride * 8 +
                             (long)local_180.begin.x * -8 +
                            CONCAT44(local_180.p._4_4_,(uint)local_180.p) + local_1d8);
          for (iVar20 = (int)local_1d0; iVar20 <= iVar9; iVar20 = iVar20 + 1) {
            if ((int)ppdVar18 <= iVar8) {
              memset(pvVar16,0,local_1c0);
              ppdVar18 = local_210;
            }
            pvVar16 = (void *)((long)pvVar16 + lVar21);
          }
          uVar13 = local_1b8;
        }
        local_1f8 = local_1f8 + 8;
        uVar13 = local_1b8 + 1;
      }
    }
    else {
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_88,local_200,(MFIter *)local_100);
      lVar21 = (long)local_1ac.smallend.vect[0];
      local_1c8 = (long)local_1ac.smallend.vect[1];
      local_1d8 = (long)local_1ac.smallend.vect[2];
      uVar6 = local_214;
      if ((int)local_214 < 1) {
        uVar6 = 0;
      }
      local_1e0 = (ulong)uVar6;
      local_1c0 = lVar21 * 8;
      local_1d0 = lVar21 * 4;
      local_210 = (pointer *)0x0;
      for (uVar13 = 0; lVar22 = local_1d8, uVar13 != local_1e0; uVar13 = uVar13 + 1) {
        for (; (int)lVar22 <= local_1ac.bigend.vect[2]; lVar22 = lVar22 + 1) {
          puVar15 = (uint32_t *)
                    ((long)&local_88.p
                            [lVar21 + ((lVar22 - local_88.begin.z) * local_88.kstride -
                                      (long)local_88.begin.x)].flag +
                    (local_1c8 - local_88.begin.y) * local_88.jstride * 4);
          for (lVar14 = local_1c8; lVar14 <= local_1ac.bigend.vect[1]; lVar14 = lVar14 + 1) {
            if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
              lVar19 = 0;
              do {
                uVar24 = 0;
                uVar25 = 0;
                if ((puVar15[lVar19] & 3) == 1) {
                  uVar24 = SUB84(local_a0.m_data[uVar13],0);
                  uVar25 = (undefined4)((ulong)local_a0.m_data[uVar13] >> 0x20);
                }
                *(ulong *)(local_180.nstride * (long)local_210 +
                           (lVar22 - local_180.begin.z) * local_180.kstride * 8 +
                           (lVar14 - local_180.begin.y) * local_180.jstride * 8 +
                           (long)local_180.begin.x * -8 +
                           CONCAT44(local_180.p._4_4_,(uint)local_180.p) + local_1c0 + lVar19 * 8) =
                     CONCAT44(uVar25,uVar24);
                lVar19 = lVar19 + 1;
              } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar19);
            }
            puVar15 = puVar15 + local_88.jstride;
          }
        }
        local_210 = local_210 + 1;
      }
    }
    MFIter::operator++((MFIter *)local_100);
    lVar21 = local_1e8;
  }
  MFIter::~MFIter((MFIter *)local_100);
  if (local_1b0 == CellCentroid) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (local_208->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar26 = Geometry::periodicity
                       (*(Geometry **)
                         ((long)&(((local_208->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                   m_geom.
                                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_190));
    local_100[0] = (undefined1)PVar26.period.vect[0];
    local_100._1_7_ = PVar26.period.vect._1_7_;
    local_100._8_4_ = PVar26.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(Periodicity *)local_100
               ,false);
  }
  PODVector<double,_std::allocator<double>_>::~PODVector(&local_a0);
  return;
}

Assistant:

void
MLEBABecLap::setEBHomogDirichlet (int amrlev, Vector<Real> const& hv_beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    Gpu::DeviceVector<Real> dv_beta(hv_beta.size());
    Gpu::copy(Gpu::hostToDevice, hv_beta.begin(), hv_beta.end(), dv_beta.begin());
    Real const* beta = dv_beta.data();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_eb_phi[amrlev], mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phifab = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            phifab(i,j,k,n) = 0.0;
        });
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    betaout(i,j,k,n) = beta[n];
                } else {
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}